

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O2

pcp_errno pcp_db_foreach_server(pcp_ctx_t *ctx,pcp_db_server_iterate f,void *data)

{
  pcp_server_t *ppVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  if ((ctx != (pcp_ctx_t *)0x0) && (f != (pcp_db_server_iterate)0x0)) {
    uVar3 = 0;
    while( true ) {
      uVar4 = (ulong)uVar3;
      if ((ctx->pcp_db).pcp_servers_length <= uVar4) {
        return PCP_ERR_MAX_SIZE;
      }
      ppVar1 = (ctx->pcp_db).pcp_servers;
      if ((ppVar1[uVar4].server_state != pss_unitialized) &&
         (iVar2 = (*f)(ppVar1 + uVar4,data), iVar2 != 0)) break;
      uVar3 = uVar3 + 1;
    }
    return PCP_ERR_SUCCESS;
  }
  __assert_fail("ctx && f",
                "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/lib/src/pcp_client_db.c"
                ,0x174,"pcp_errno pcp_db_foreach_server(pcp_ctx_t *, pcp_db_server_iterate, void *)"
               );
}

Assistant:

pcp_errno pcp_db_foreach_server(pcp_ctx_t *ctx, pcp_db_server_iterate f,
                                void *data) {
    uint32_t indx;
    int ret = PCP_ERR_MAX_SIZE;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    assert(ctx && f);

    for (indx = 0; indx < ctx->pcp_db.pcp_servers_length; ++indx) {
        if (ctx->pcp_db.pcp_servers[indx].server_state == pss_unitialized) {
            continue;
        }
        if ((*f)(ctx->pcp_db.pcp_servers + indx, data)) {
            ret = PCP_ERR_SUCCESS;
            break;
        }
    }
    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return ret;
}